

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcondensedcompel.cpp
# Opt level: O0

void __thiscall TPZCondensedCompEl::Unwrap(TPZCondensedCompEl *this)

{
  int iVar1;
  TPZCompEl **ppTVar2;
  TPZConnect *this_00;
  TPZGeoEl *this_01;
  TPZCompMesh *this_02;
  long *in_RDI;
  TPZGeoEl *gel;
  int ic;
  int ncon;
  TPZCompEl *ReferenceEl;
  int64_t myindex;
  TPZCompEl *in_stack_000001b0;
  TPZCompEl *in_stack_ffffffffffffffd8;
  int local_20;
  int64_t in_stack_ffffffffffffffe8;
  TPZCompEl *pTVar3;
  TPZCompEl *elp;
  TPZChunkVector<TPZCompEl_*,_10> *this_03;
  
  this_03 = (TPZChunkVector<TPZCompEl_*,_10> *)in_RDI[2];
  TPZCompMesh::ElementVec((TPZCompMesh *)in_RDI[1]);
  ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[](this_03,in_stack_ffffffffffffffe8);
  *ppTVar2 = (TPZCompEl *)0x0;
  pTVar3 = (TPZCompEl *)in_RDI[0x6b];
  iVar1 = (**(code **)(*in_RDI + 0x90))();
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))();
    TPZConnect::SetCondensed(this_00,false);
  }
  this_01 = TPZCompEl::Reference(in_stack_ffffffffffffffd8);
  if (this_01 != (TPZGeoEl *)0x0) {
    TPZGeoEl::ResetReference(this_01);
  }
  if (in_RDI != (long *)0x0) {
    (**(code **)(*in_RDI + 8))();
  }
  elp = pTVar3;
  this_02 = TPZCompEl::Mesh(in_stack_000001b0);
  TPZCompMesh::ElementVec(this_02);
  ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[](this_03,(int64_t)elp);
  *ppTVar2 = pTVar3;
  if (this_01 != (TPZGeoEl *)0x0) {
    TPZGeoEl::SetReference(this_01,elp);
  }
  return;
}

Assistant:

void TPZCondensedCompEl::Unwrap()
{
    int64_t myindex = fIndex;
    fMesh->ElementVec()[myindex] = 0;
    TPZCompEl *ReferenceEl = fReferenceCompEl;
    int ncon = NConnects();
    for (int ic=0; ic<ncon ; ic++) {
        Connect(ic).SetCondensed(false);
    }
    TPZGeoEl *gel = Reference();
    if (gel) {
        gel->ResetReference();
    }
    delete this;
    ReferenceEl->Mesh()->ElementVec()[myindex] = ReferenceEl;
    if (gel) {
        gel->SetReference(ReferenceEl);
    }
}